

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,int64_t cost_threshold_in,uint64_t *cost)

{
  int length;
  uint32_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint trivial_at_end;
  
  if (cost_threshold_in < 1) {
    uVar5 = 0;
  }
  else {
    length = (1 << ((byte)a->palette_code_bits_ & 0x1f)) + 0x118;
    if (a->palette_code_bits_ < 1) {
      length = 0x118;
    }
    uVar2 = GetCombinedEntropy(a->literal_,b->literal_,length,(uint)a->is_used_[0],
                               (uint)b->is_used_[0],0);
    *cost = uVar2;
    uVar1 = (*VP8LExtraCostCombined)(a->literal_ + 0x100,b->literal_ + 0x100,0x18);
    uVar3 = (ulong)uVar1 * 0x800000 + *cost;
    *cost = uVar3;
    uVar5 = 0;
    if (uVar3 < (ulong)cost_threshold_in) {
      uVar5 = a->trivial_symbol_;
      trivial_at_end = 0;
      if ((((uVar5 != 0xffffffff) && (uVar5 == b->trivial_symbol_)) &&
          (uVar5 + 0x1000000 < 0x2000000)) &&
         (((char)(uVar5 >> 0x10) == -1 || ((uVar5 >> 0x10 & 0xff) == 0)))) {
        trivial_at_end = (uint)((uVar5 & 0xff) == 0 || (uVar5 & 0xff) == 0xff);
      }
      uVar4 = GetCombinedEntropy(a->red_,b->red_,0x100,(uint)a->is_used_[1],(uint)b->is_used_[1],
                                 trivial_at_end);
      uVar2 = *cost;
      *cost = uVar4 + uVar2;
      uVar5 = 0;
      if (uVar4 + uVar2 < (ulong)cost_threshold_in) {
        uVar4 = GetCombinedEntropy(a->blue_,b->blue_,0x100,(uint)a->is_used_[2],(uint)b->is_used_[2]
                                   ,trivial_at_end);
        uVar2 = *cost;
        *cost = uVar4 + uVar2;
        if (uVar4 + uVar2 < (ulong)cost_threshold_in) {
          uVar4 = GetCombinedEntropy(a->alpha_,b->alpha_,0x100,(uint)a->is_used_[3],
                                     (uint)b->is_used_[3],trivial_at_end);
          uVar2 = *cost;
          *cost = uVar4 + uVar2;
          uVar5 = 0;
          if (uVar4 + uVar2 < (ulong)cost_threshold_in) {
            uVar2 = GetCombinedEntropy(a->distance_,b->distance_,0x28,(uint)a->is_used_[4],
                                       (uint)b->is_used_[4],0);
            *cost = *cost + uVar2;
            uVar1 = (*VP8LExtraCostCombined)(a->distance_,b->distance_,0x28);
            uVar3 = (ulong)uVar1 * 0x800000 + *cost;
            *cost = uVar3;
            uVar5 = (uint)(uVar3 < (ulong)cost_threshold_in);
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

WEBP_NODISCARD static int GetCombinedHistogramEntropy(
    const VP8LHistogram* const a, const VP8LHistogram* const b,
    int64_t cost_threshold_in, uint64_t* cost) {
  const int palette_code_bits = a->palette_code_bits_;
  int trivial_at_end = 0;
  const uint64_t cost_threshold = (uint64_t)cost_threshold_in;
  assert(a->palette_code_bits_ == b->palette_code_bits_);
  if (cost_threshold_in <= 0) return 0;
  *cost = GetCombinedEntropy(a->literal_, b->literal_,
                             VP8LHistogramNumCodes(palette_code_bits),
                             a->is_used_[0], b->is_used_[0], 0);
  *cost += (uint64_t)VP8LExtraCostCombined(a->literal_ + NUM_LITERAL_CODES,
                                           b->literal_ + NUM_LITERAL_CODES,
                                           NUM_LENGTH_CODES)
           << LOG_2_PRECISION_BITS;
  if (*cost >= cost_threshold) return 0;

  if (a->trivial_symbol_ != VP8L_NON_TRIVIAL_SYM &&
      a->trivial_symbol_ == b->trivial_symbol_) {
    // A, R and B are all 0 or 0xff.
    const uint32_t color_a = (a->trivial_symbol_ >> 24) & 0xff;
    const uint32_t color_r = (a->trivial_symbol_ >> 16) & 0xff;
    const uint32_t color_b = (a->trivial_symbol_ >> 0) & 0xff;
    if ((color_a == 0 || color_a == 0xff) &&
        (color_r == 0 || color_r == 0xff) &&
        (color_b == 0 || color_b == 0xff)) {
      trivial_at_end = 1;
    }
  }

  *cost += GetCombinedEntropy(a->red_, b->red_, NUM_LITERAL_CODES,
                              a->is_used_[1], b->is_used_[1], trivial_at_end);
  if (*cost >= cost_threshold) return 0;

  *cost += GetCombinedEntropy(a->blue_, b->blue_, NUM_LITERAL_CODES,
                              a->is_used_[2], b->is_used_[2], trivial_at_end);
  if (*cost >= cost_threshold) return 0;

  *cost += GetCombinedEntropy(a->alpha_, b->alpha_, NUM_LITERAL_CODES,
                              a->is_used_[3], b->is_used_[3], trivial_at_end);
  if (*cost >= cost_threshold) return 0;

  *cost += GetCombinedEntropy(a->distance_, b->distance_, NUM_DISTANCE_CODES,
                              a->is_used_[4], b->is_used_[4], 0);
  *cost += (uint64_t)VP8LExtraCostCombined(a->distance_, b->distance_,
                                           NUM_DISTANCE_CODES)
           << LOG_2_PRECISION_BITS;
  if (*cost >= cost_threshold) return 0;

  return 1;
}